

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOut_Constractor4_Test::ConfidentialTxOut_Constractor4_Test
          (ConfidentialTxOut_Constractor4_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00708258;
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor4) {
  // ConfidentialAssetId, ConfidentialValue
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}